

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmcalc.cpp
# Opt level: O0

void __thiscall
fmcalc::compute_item_proportions
          (fmcalc *this,
          vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
          *agg_vecs,vector<float,_std::allocator<float>_> *guls,uint level_,uint layer_,
          uint previous_layer_,bool allowzeros)

{
  allocator<int> *this_00;
  __node_base_ptr *this_01;
  float fVar1;
  float fVar2;
  OASIS_FLOAT OVar3;
  int iVar4;
  vector<int,_std::allocator<int>_> *pvVar5;
  ulong uVar6;
  pointer piVar7;
  bool bVar8;
  size_type sVar9;
  reference pvVar10;
  reference pvVar11;
  reference pvVar12;
  pointer pLVar13;
  reference piVar14;
  reference pvVar15;
  element_type *peVar16;
  const_reference pvVar17;
  reference pvVar18;
  reference pvVar19;
  pointer piVar20;
  int *piVar21;
  reference piVar22;
  reference pvVar23;
  const_reference pvVar24;
  element_type *this_02;
  value_type_conflict1 local_3b0;
  value_type_conflict1 local_3ac;
  value_type_conflict1 local_3a8;
  float local_3a4;
  ulong local_3a0;
  size_t i_4;
  vector<int,_std::allocator<int>_> *z;
  undefined1 auStack_388 [4];
  int j_1;
  pointer pfStack_380;
  pointer local_378;
  vector<float,_std::allocator<float>_> local_370;
  int *local_358;
  _Node_iterator_base<int,_false> local_350;
  _Node_iterator_base<int,_false> local_348;
  _Node_iterator_base<int,_false> local_340;
  iterator s_iter;
  OASIS_FLOAT prev_gul_total;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_318;
  undefined1 local_310 [8];
  unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> s;
  const_iterator it_1;
  size_t y;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_2b8;
  __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> local_2b0;
  const_iterator it;
  int local_29c;
  iterator iStack_298;
  int j;
  iterator iter_2;
  undefined1 local_288 [8];
  vector<int,_std::allocator<int>_> v_2;
  size_t i_3;
  vector<LossRec,_std::allocator<LossRec>_> *prev_agg_vec_base;
  vector<LossRec,_std::allocator<LossRec>_> *prev_agg_vec_1;
  size_t i_2;
  size_t iMax;
  vector<LossRec,_std::allocator<LossRec>_> *current_agg_vec;
  vector<LossRec,_std::allocator<LossRec>_> *prev_agg_vec;
  vector<float,_std::allocator<float>_> *v_1;
  const_iterator cStack_220;
  int idx_5;
  const_iterator __end8;
  const_iterator __begin8;
  vector<int,_std::allocator<int>_> *__range8;
  int i_1;
  int idx_4;
  const_iterator __end7_2;
  const_iterator __begin7_2;
  vector<int,_std::allocator<int>_> *__range7_2;
  OASIS_FLOAT prop_total;
  vector<float,_std::allocator<float>_> *v;
  const_iterator cStack_1d0;
  int idx_3;
  const_iterator __end7_1;
  const_iterator __begin7_1;
  vector<int,_std::allocator<int>_> *__range7_1;
  int i;
  int idx_2;
  const_iterator __end7;
  const_iterator __begin7;
  vector<int,_std::allocator<int>_> *__range7;
  iterator iStack_190;
  OASIS_FLOAT total_1;
  int local_184;
  iterator iStack_180;
  int agg_vec_idx;
  LossRec *local_178;
  int local_16c;
  const_iterator cStack_168;
  int idx_1;
  const_iterator __end6_1;
  const_iterator __begin6_1;
  vector<int,_std::allocator<int>_> *__range6_1;
  __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_> local_148;
  iterator iter_1;
  const_iterator cStack_130;
  int idx;
  const_iterator __end6;
  const_iterator __begin6;
  vector<int,_std::allocator<int>_> *__range6;
  vector<float,_std::allocator<float>_> local_110;
  undefined1 local_f8 [20];
  value_type_conflict1 local_e4;
  vector<float,_std::allocator<float>_> local_e0;
  undefined1 local_c8 [20];
  OASIS_FLOAT local_b4;
  iterator iStack_b0;
  OASIS_FLOAT total;
  __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_> local_a8;
  iterator iter;
  __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_> local_98;
  __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_> local_90;
  iterator p_iter;
  OASIS_FLOAT previous_proportions_total;
  OASIS_FLOAT retained_loss_total;
  OASIS_FLOAT loss_total;
  vector<LossRec,_std::allocator<LossRec>_> *previous_agg_vec;
  vector<LossRec,_std::allocator<LossRec>_> *agg_vec;
  int level;
  int to_level;
  int from_level;
  allocator<float> local_4d;
  value_type_conflict1 local_4c;
  undefined1 local_48 [8];
  vector<float,_std::allocator<float>_> items_prop;
  bool allowzeros_local;
  uint previous_layer__local;
  uint layer__local;
  uint level__local;
  vector<float,_std::allocator<float>_> *guls_local;
  vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
  *agg_vecs_local;
  fmcalc *this_local;
  
  items_prop.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._3_1_ = allowzeros;
  items_prop.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage._4_4_ = previous_layer_;
  if (layer_ == 1) {
    sVar9 = std::vector<float,_std::allocator<float>_>::size(guls);
    local_4c = 0.0;
    std::allocator<float>::allocator(&local_4d);
    std::vector<float,_std::allocator<float>_>::vector
              ((vector<float,_std::allocator<float>_> *)local_48,sVar9,&local_4c,&local_4d);
    std::allocator<float>::~allocator(&local_4d);
    sVar9 = std::
            vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
            ::size(agg_vecs);
    agg_vec._4_4_ = (int)sVar9;
    if (this->allocrule_ == 3) {
      agg_vec._4_4_ = level_ + 1;
    }
    for (agg_vec._0_4_ = 1; (int)agg_vec < agg_vec._4_4_; agg_vec._0_4_ = (int)agg_vec + 1) {
      pvVar10 = std::
                vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                ::operator[](agg_vecs,(long)(int)agg_vec);
      pvVar11 = std::
                vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                ::operator[](pvVar10,1);
      pvVar10 = std::
                vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                ::operator[](agg_vecs,(long)((int)agg_vec + -1));
      pvVar12 = std::
                vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                ::operator[](pvVar10,1);
      previous_proportions_total = 0.0;
      p_iter._M_current._4_4_ = 0.0;
      local_90._M_current =
           (LossRec *)std::vector<LossRec,_std::allocator<LossRec>_>::begin(pvVar12);
      while( true ) {
        local_98._M_current =
             (LossRec *)std::vector<LossRec,_std::allocator<LossRec>_>::end(pvVar12);
        bVar8 = __gnu_cxx::operator!=(&local_90,&local_98);
        if (!bVar8) break;
        pLVar13 = __gnu_cxx::
                  __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>::
                  operator->(&local_90);
        p_iter._M_current._4_4_ = pLVar13->proportion + p_iter._M_current._4_4_;
        iter._M_current =
             (LossRec *)
             __gnu_cxx::
             __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>::
             operator++(&local_90,0);
      }
      local_a8._M_current =
           (LossRec *)std::vector<LossRec,_std::allocator<LossRec>_>::begin(pvVar11);
      while( true ) {
        iStack_b0 = std::vector<LossRec,_std::allocator<LossRec>_>::end(pvVar11);
        bVar8 = __gnu_cxx::operator!=(&local_a8,&stack0xffffffffffffff50);
        if (!bVar8) break;
        pLVar13 = __gnu_cxx::
                  __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>::
                  operator->(&local_a8);
        if (((0.0 < pLVar13->loss) ||
            (pLVar13 = __gnu_cxx::
                       __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>
                       ::operator->(&local_a8), 0.0 < pLVar13->retained_loss)) ||
           ((items_prop.super__Vector_base<float,_std::allocator<float>_>._M_impl.
             super__Vector_impl_data._M_end_of_storage._3_1_ & 1) == 1)) {
          local_b4 = 0.0;
          pLVar13 = __gnu_cxx::
                    __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>::
                    operator->(&local_a8);
          if (pLVar13->item_idx != (vector<int,_std::allocator<int>_> *)0x0) {
            pLVar13 = __gnu_cxx::
                      __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>
                      ::operator->(&local_a8);
            bVar8 = std::operator==(&pLVar13->item_prop,(nullptr_t)0x0);
            if (bVar8) {
              pLVar13 = __gnu_cxx::
                        __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>
                        ::operator->(&local_a8);
              sVar9 = std::vector<int,_std::allocator<int>_>::size(pLVar13->item_idx);
              local_e4 = 0.0;
              std::allocator<float>::allocator((allocator<float> *)(local_f8 + 0x13));
              std::vector<float,_std::allocator<float>_>::vector
                        (&local_e0,sVar9,&local_e4,(allocator<float> *)(local_f8 + 0x13));
              std::
              make_shared<std::vector<float,std::allocator<float>>,std::vector<float,std::allocator<float>>>
                        ((vector<float,_std::allocator<float>_> *)local_c8);
              pLVar13 = __gnu_cxx::
                        __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>
                        ::operator->(&local_a8);
              std::shared_ptr<std::vector<float,_std::allocator<float>_>_>::operator=
                        (&pLVar13->item_prop,
                         (shared_ptr<std::vector<float,_std::allocator<float>_>_> *)local_c8);
              std::shared_ptr<std::vector<float,_std::allocator<float>_>_>::~shared_ptr
                        ((shared_ptr<std::vector<float,_std::allocator<float>_>_> *)local_c8);
              std::vector<float,_std::allocator<float>_>::~vector(&local_e0);
              std::allocator<float>::~allocator((allocator<float> *)(local_f8 + 0x13));
            }
            else {
              pLVar13 = __gnu_cxx::
                        __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>
                        ::operator->(&local_a8);
              sVar9 = std::vector<int,_std::allocator<int>_>::size(pLVar13->item_idx);
              __range6._4_4_ = 0;
              std::allocator<float>::allocator((allocator<float> *)((long)&__range6 + 3));
              std::vector<float,_std::allocator<float>_>::vector
                        (&local_110,sVar9,(value_type_conflict1 *)((long)&__range6 + 4),
                         (allocator<float> *)((long)&__range6 + 3));
              std::
              make_shared<std::vector<float,std::allocator<float>>,std::vector<float,std::allocator<float>>>
                        ((vector<float,_std::allocator<float>_> *)local_f8);
              pLVar13 = __gnu_cxx::
                        __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>
                        ::operator->(&local_a8);
              std::shared_ptr<std::vector<float,_std::allocator<float>_>_>::operator=
                        (&pLVar13->item_prop,
                         (shared_ptr<std::vector<float,_std::allocator<float>_>_> *)local_f8);
              std::shared_ptr<std::vector<float,_std::allocator<float>_>_>::~shared_ptr
                        ((shared_ptr<std::vector<float,_std::allocator<float>_>_> *)local_f8);
              std::vector<float,_std::allocator<float>_>::~vector(&local_110);
              std::allocator<float>::~allocator((allocator<float> *)((long)&__range6 + 3));
            }
            pLVar13 = __gnu_cxx::
                      __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>
                      ::operator->(&local_a8);
            pvVar5 = pLVar13->item_idx;
            __end6 = std::vector<int,_std::allocator<int>_>::begin(pvVar5);
            cStack_130 = std::vector<int,_std::allocator<int>_>::end(pvVar5);
            while (bVar8 = __gnu_cxx::operator!=(&__end6,&stack0xfffffffffffffed0), bVar8) {
              piVar14 = __gnu_cxx::
                        __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                        operator*(&__end6);
              pvVar17 = std::vector<float,_std::allocator<float>_>::operator[](guls,(long)*piVar14);
              local_b4 = *pvVar17 + local_b4;
              __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator++(&__end6);
            }
          }
          OVar3 = local_b4;
          pLVar13 = __gnu_cxx::
                    __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>::
                    operator->(&local_a8);
          pLVar13->gul_total = OVar3;
          pLVar13 = __gnu_cxx::
                    __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>::
                    operator->(&local_a8);
          previous_proportions_total = pLVar13->loss + previous_proportions_total;
          __gnu_cxx::__normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>::
          operator->(&local_a8);
        }
        else {
          pLVar13 = __gnu_cxx::
                    __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>::
                    operator->(&local_a8);
          pLVar13->gul_total = 0.0;
          __gnu_cxx::__normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>::
          operator->(&local_a8);
        }
        iter_1._M_current =
             (LossRec *)
             __gnu_cxx::
             __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>::
             operator++(&local_a8,0);
      }
      if ((0.0 < previous_proportions_total) || (p_iter._M_current._4_4_ <= 0.01)) {
        iStack_180 = std::vector<LossRec,_std::allocator<LossRec>_>::begin(pvVar11);
        local_184 = 0;
        local_a8._M_current = iStack_180._M_current;
        while( true ) {
          iStack_190 = std::vector<LossRec,_std::allocator<LossRec>_>::end(pvVar11);
          bVar8 = __gnu_cxx::operator!=(&local_a8,&stack0xfffffffffffffe70);
          if (!bVar8) break;
          pLVar13 = __gnu_cxx::
                    __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>::
                    operator->(&local_a8);
          if ((pLVar13->loss <= 0.0) || (previous_proportions_total <= 0.0)) {
            pLVar13 = __gnu_cxx::
                      __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>
                      ::operator->(&local_a8);
            pLVar13->proportion = 0.0;
          }
          else {
            pLVar13 = __gnu_cxx::
                      __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>
                      ::operator->(&local_a8);
            fVar1 = pLVar13->loss;
            pLVar13 = __gnu_cxx::
                      __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>
                      ::operator->(&local_a8);
            pLVar13->proportion = fVar1 / previous_proportions_total;
          }
          if ((int)agg_vec == 1) {
            __range7._4_4_ = 0.0;
            pLVar13 = __gnu_cxx::
                      __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>
                      ::operator->(&local_a8);
            if (pLVar13->item_idx != (vector<int,_std::allocator<int>_> *)0x0) {
              pLVar13 = __gnu_cxx::
                        __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>
                        ::operator->(&local_a8);
              pvVar5 = pLVar13->item_idx;
              __end7 = std::vector<int,_std::allocator<int>_>::begin(pvVar5);
              _i = std::vector<int,_std::allocator<int>_>::end(pvVar5);
              while (bVar8 = __gnu_cxx::operator!=
                                       (&__end7,(__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                                 *)&i), bVar8) {
                piVar14 = __gnu_cxx::
                          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator*(&__end7);
                pvVar17 = std::vector<float,_std::allocator<float>_>::operator[]
                                    (guls,(long)*piVar14);
                __range7._4_4_ = *pvVar17 + __range7._4_4_;
                __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator++(&__end7);
              }
            }
            __range7_1._0_4_ = 0;
            if (0.0 < __range7._4_4_) {
              pLVar13 = __gnu_cxx::
                        __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>
                        ::operator->(&local_a8);
              pvVar5 = pLVar13->item_idx;
              __end7_1 = std::vector<int,_std::allocator<int>_>::begin(pvVar5);
              cStack_1d0 = std::vector<int,_std::allocator<int>_>::end(pvVar5);
              while (bVar8 = __gnu_cxx::operator!=(&__end7_1,&stack0xfffffffffffffe30), bVar8) {
                piVar14 = __gnu_cxx::
                          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator*(&__end7_1);
                iVar4 = *piVar14;
                pLVar13 = __gnu_cxx::
                          __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>
                          ::operator->(&local_a8);
                bVar8 = std::operator!=(&pLVar13->item_prop,(nullptr_t)0x0);
                if (bVar8) {
                  pLVar13 = __gnu_cxx::
                            __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>
                            ::operator->(&local_a8);
                  peVar16 = std::
                            __shared_ptr_access<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            ::operator*((__shared_ptr_access<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)&pLVar13->item_prop);
                  pvVar17 = std::vector<float,_std::allocator<float>_>::operator[](guls,(long)iVar4)
                  ;
                  fVar1 = *pvVar17;
                  pLVar13 = __gnu_cxx::
                            __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>
                            ::operator->(&local_a8);
                  fVar2 = pLVar13->gul_total;
                  pvVar15 = std::vector<float,_std::allocator<float>_>::operator[]
                                      (peVar16,(long)(int)__range7_1);
                  *pvVar15 = fVar1 / fVar2;
                }
                pvVar17 = std::vector<float,_std::allocator<float>_>::operator[](guls,(long)iVar4);
                fVar1 = *pvVar17;
                pLVar13 = __gnu_cxx::
                          __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>
                          ::operator->(&local_a8);
                fVar2 = pLVar13->proportion;
                pvVar15 = std::vector<float,_std::allocator<float>_>::operator[]
                                    ((vector<float,_std::allocator<float>_> *)local_48,(long)iVar4);
                *pvVar15 = (fVar1 / __range7._4_4_) * fVar2;
                __range7_1._0_4_ = (int)__range7_1 + 1;
                __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator++(&__end7_1);
              }
            }
          }
          else {
            __range7_2._4_4_ = 0.0;
            pLVar13 = __gnu_cxx::
                      __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>
                      ::operator->(&local_a8);
            if (pLVar13->item_idx != (vector<int,_std::allocator<int>_> *)0x0) {
              pLVar13 = __gnu_cxx::
                        __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>
                        ::operator->(&local_a8);
              pvVar5 = pLVar13->item_idx;
              __end7_2 = std::vector<int,_std::allocator<int>_>::begin(pvVar5);
              _i_1 = std::vector<int,_std::allocator<int>_>::end(pvVar5);
              while (bVar8 = __gnu_cxx::operator!=
                                       (&__end7_2,
                                        (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                         *)&i_1), bVar8) {
                piVar14 = __gnu_cxx::
                          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator*(&__end7_2);
                pvVar15 = std::vector<float,_std::allocator<float>_>::operator[]
                                    ((vector<float,_std::allocator<float>_> *)local_48,
                                     (long)*piVar14);
                __range7_2._4_4_ = *pvVar15 + __range7_2._4_4_;
                __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                operator++(&__end7_2);
              }
            }
            __range8._0_4_ = 0;
            if (__range7_2._4_4_ <= 0.0) {
              pLVar13 = __gnu_cxx::
                        __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>
                        ::operator->(&local_a8);
              if (pLVar13->item_idx != (vector<int,_std::allocator<int>_> *)0x0) {
                pvVar18 = std::vector<LossRec,_std::allocator<LossRec>_>::operator[]
                                    (pvVar12,(long)local_184);
                pLVar13 = __gnu_cxx::
                          __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>
                          ::operator->(&local_a8);
                std::shared_ptr<std::vector<float,_std::allocator<float>_>_>::operator=
                          (&pLVar13->item_prop,&pvVar18->item_prop);
              }
            }
            else {
              pLVar13 = __gnu_cxx::
                        __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>
                        ::operator->(&local_a8);
              if (pLVar13->item_idx != (vector<int,_std::allocator<int>_> *)0x0) {
                pLVar13 = __gnu_cxx::
                          __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>
                          ::operator->(&local_a8);
                pvVar5 = pLVar13->item_idx;
                __end8 = std::vector<int,_std::allocator<int>_>::begin(pvVar5);
                cStack_220 = std::vector<int,_std::allocator<int>_>::end(pvVar5);
                while (bVar8 = __gnu_cxx::operator!=(&__end8,&stack0xfffffffffffffde0), bVar8) {
                  piVar14 = __gnu_cxx::
                            __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                            ::operator*(&__end8);
                  iVar4 = *piVar14;
                  pLVar13 = __gnu_cxx::
                            __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>
                            ::operator->(&local_a8);
                  bVar8 = std::operator!=(&pLVar13->item_prop,(nullptr_t)0x0);
                  if (bVar8) {
                    pLVar13 = __gnu_cxx::
                              __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>
                              ::operator->(&local_a8);
                    peVar16 = std::
                              __shared_ptr_access<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                              ::operator*((__shared_ptr_access<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                           *)&pLVar13->item_prop);
                    pvVar15 = std::vector<float,_std::allocator<float>_>::operator[]
                                        ((vector<float,_std::allocator<float>_> *)local_48,
                                         (long)iVar4);
                    fVar1 = *pvVar15;
                    pvVar15 = std::vector<float,_std::allocator<float>_>::operator[]
                                        (peVar16,(long)(int)__range8);
                    *pvVar15 = fVar1 / __range7_2._4_4_;
                  }
                  pvVar15 = std::vector<float,_std::allocator<float>_>::operator[]
                                      ((vector<float,_std::allocator<float>_> *)local_48,(long)iVar4
                                      );
                  fVar1 = *pvVar15;
                  pLVar13 = __gnu_cxx::
                            __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>
                            ::operator->(&local_a8);
                  fVar2 = pLVar13->proportion;
                  pvVar15 = std::vector<float,_std::allocator<float>_>::operator[]
                                      ((vector<float,_std::allocator<float>_> *)local_48,(long)iVar4
                                      );
                  *pvVar15 = (fVar1 / __range7_2._4_4_) * fVar2;
                  __range8._0_4_ = (int)__range8 + 1;
                  __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                  ::operator++(&__end8);
                }
              }
            }
          }
          __gnu_cxx::__normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>::
          operator++(&local_a8,0);
          local_184 = local_184 + 1;
        }
      }
      else {
        local_148._M_current =
             (LossRec *)std::vector<LossRec,_std::allocator<LossRec>_>::begin(pvVar11);
        while( true ) {
          __range6_1 = (vector<int,_std::allocator<int>_> *)
                       std::vector<LossRec,_std::allocator<LossRec>_>::end(pvVar11);
          bVar8 = __gnu_cxx::operator!=
                            (&local_148,
                             (__normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>
                              *)&__range6_1);
          if (!bVar8) break;
          pLVar13 = __gnu_cxx::
                    __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>::
                    operator->(&local_148);
          if (pLVar13->item_idx != (vector<int,_std::allocator<int>_> *)0x0) {
            pLVar13 = __gnu_cxx::
                      __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>
                      ::operator->(&local_148);
            pvVar5 = pLVar13->item_idx;
            __end6_1 = std::vector<int,_std::allocator<int>_>::begin(pvVar5);
            cStack_168 = std::vector<int,_std::allocator<int>_>::end(pvVar5);
            while (bVar8 = __gnu_cxx::operator!=(&__end6_1,&stack0xfffffffffffffe98), bVar8) {
              piVar14 = __gnu_cxx::
                        __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                        operator*(&__end6_1);
              local_16c = *piVar14;
              pLVar13 = __gnu_cxx::
                        __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>
                        ::operator->(&local_148);
              fVar1 = pLVar13->proportion;
              pvVar15 = std::vector<float,_std::allocator<float>_>::operator[]
                                  ((vector<float,_std::allocator<float>_> *)local_48,(long)local_16c
                                  );
              fVar2 = *pvVar15;
              pLVar13 = __gnu_cxx::
                        __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>
                        ::operator->(&local_148);
              pLVar13->proportion = fVar1 + fVar2;
              __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
              operator++(&__end6_1);
            }
          }
          local_178 = (LossRec *)
                      __gnu_cxx::
                      __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>
                      ::operator++(&local_148,0);
        }
      }
    }
    std::vector<float,_std::allocator<float>_>::~vector
              ((vector<float,_std::allocator<float>_> *)local_48);
  }
  else if (previous_layer_ < layer_) {
    pvVar10 = std::
              vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
              ::operator[](agg_vecs,(ulong)level_);
    pvVar11 = std::
              vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
              ::operator[](pvVar10,1);
    pvVar10 = std::
              vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
              ::operator[](agg_vecs,(ulong)level_);
    pvVar12 = std::
              vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
              ::operator[](pvVar10,(ulong)layer_);
    i_2 = std::vector<LossRec,_std::allocator<LossRec>_>::size(pvVar11);
    sVar9 = std::vector<LossRec,_std::allocator<LossRec>_>::size(pvVar12);
    if (i_2 < sVar9) {
      i_2 = std::vector<LossRec,_std::allocator<LossRec>_>::size(pvVar12);
    }
    for (prev_agg_vec_1 = (vector<LossRec,_std::allocator<LossRec>_> *)0x0; prev_agg_vec_1 < i_2;
        prev_agg_vec_1 =
             (vector<LossRec,_std::allocator<LossRec>_> *)
             ((long)&(prev_agg_vec_1->super__Vector_base<LossRec,_std::allocator<LossRec>_>)._M_impl
                     .super__Vector_impl_data._M_start + 1)) {
      pvVar18 = std::vector<LossRec,_std::allocator<LossRec>_>::operator[]
                          (pvVar11,(size_type)prev_agg_vec_1);
      OVar3 = pvVar18->proportion;
      pvVar18 = std::vector<LossRec,_std::allocator<LossRec>_>::operator[]
                          (pvVar12,(size_type)prev_agg_vec_1);
      pvVar18->proportion = OVar3;
      pvVar18 = std::vector<LossRec,_std::allocator<LossRec>_>::operator[]
                          (pvVar11,(size_type)prev_agg_vec_1);
      pvVar19 = std::vector<LossRec,_std::allocator<LossRec>_>::operator[]
                          (pvVar12,(size_type)prev_agg_vec_1);
      std::shared_ptr<std::vector<float,_std::allocator<float>_>_>::operator=
                (&pvVar19->item_prop,&pvVar18->item_prop);
    }
  }
  else {
    pvVar10 = std::
              vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
              ::operator[](agg_vecs,(ulong)(level_ - 1));
    pvVar11 = std::
              vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
              ::operator[](pvVar10,(ulong)items_prop.
                                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                          super__Vector_impl_data._M_end_of_storage._4_4_);
    pvVar10 = std::
              vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
              ::operator[](agg_vecs,(ulong)(level_ - 1));
    pvVar12 = std::
              vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
              ::operator[](pvVar10,1);
    for (v_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage = (pointer)0x0;
        piVar7 = v_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
                 _M_end_of_storage,
        piVar20 = (pointer)std::vector<LossRec,_std::allocator<LossRec>_>::size(pvVar11),
        piVar7 < piVar20;
        v_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage =
             (pointer)((long)v_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage + 1)) {
      pvVar18 = std::vector<LossRec,_std::allocator<LossRec>_>::operator[]
                          (pvVar11,(size_type)
                                   v_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                   super__Vector_impl_data._M_end_of_storage);
      bVar8 = std::operator==(&pvVar18->item_prop,(nullptr_t)0x0);
      if (bVar8) {
        pvVar18 = std::vector<LossRec,_std::allocator<LossRec>_>::operator[]
                            (pvVar12,(size_type)
                                     v_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage);
        pvVar19 = std::vector<LossRec,_std::allocator<LossRec>_>::operator[]
                            (pvVar11,(size_type)
                                     v_2.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                     super__Vector_impl_data._M_end_of_storage);
        std::shared_ptr<std::vector<float,_std::allocator<float>_>_>::operator=
                  (&pvVar19->item_prop,&pvVar18->item_prop);
      }
    }
    sVar9 = std::vector<float,_std::allocator<float>_>::size(guls);
    iter_2._M_current._4_4_ = 0xffffffff;
    this_00 = (allocator<int> *)((long)&iter_2._M_current + 3);
    std::allocator<int>::allocator(this_00);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)local_288,sVar9,
               (value_type_conflict *)((long)&iter_2._M_current + 4),this_00);
    std::allocator<int>::~allocator((allocator<int> *)((long)&iter_2._M_current + 3));
    iStack_298 = std::vector<LossRec,_std::allocator<LossRec>_>::begin(pvVar11);
    local_29c = 0;
    while( true ) {
      it._M_current = (int *)std::vector<LossRec,_std::allocator<LossRec>_>::end(pvVar11);
      bVar8 = __gnu_cxx::operator!=
                        (&stack0xfffffffffffffd68,
                         (__normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>
                          *)&it);
      if (!bVar8) break;
      pLVar13 = __gnu_cxx::
                __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>::
                operator->(&stack0xfffffffffffffd68);
      if (pLVar13->item_idx != (vector<int,_std::allocator<int>_> *)0x0) {
        pLVar13 = __gnu_cxx::
                  __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>::
                  operator->(&stack0xfffffffffffffd68);
        local_2b0._M_current =
             (int *)std::vector<int,_std::allocator<int>_>::begin(pLVar13->item_idx);
        while( true ) {
          pLVar13 = __gnu_cxx::
                    __normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>::
                    operator->(&stack0xfffffffffffffd68);
          local_2b8._M_current =
               (int *)std::vector<int,_std::allocator<int>_>::end(pLVar13->item_idx);
          bVar8 = __gnu_cxx::operator!=(&local_2b0,&local_2b8);
          if (!bVar8) break;
          piVar14 = __gnu_cxx::
                    __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator*(&local_2b0);
          pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)local_288,(long)*piVar14);
          *pvVar23 = local_29c;
          __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
          operator++(&local_2b0,0);
        }
      }
      local_29c = local_29c + 1;
      __gnu_cxx::__normal_iterator<LossRec_*,_std::vector<LossRec,_std::allocator<LossRec>_>_>::
      operator++(&stack0xfffffffffffffd68,0);
    }
    it_1._M_current = (int *)0x0;
    while( true ) {
      pvVar10 = std::
                vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                ::operator[](agg_vecs,(ulong)level_);
      pvVar12 = std::
                vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                ::operator[](pvVar10,(ulong)layer_);
      piVar21 = (int *)std::vector<LossRec,_std::allocator<LossRec>_>::size(pvVar12);
      if (piVar21 <= it_1._M_current) break;
      pvVar10 = std::
                vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                ::operator[](agg_vecs,(ulong)level_);
      pvVar12 = std::
                vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                ::operator[](pvVar10,(ulong)layer_);
      pvVar18 = std::vector<LossRec,_std::allocator<LossRec>_>::operator[]
                          (pvVar12,(size_type)it_1._M_current);
      if (pvVar18->item_idx != (vector<int,_std::allocator<int>_> *)0x0) {
        pvVar10 = std::
                  vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                  ::operator[](agg_vecs,(ulong)level_);
        pvVar12 = std::
                  vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                  ::operator[](pvVar10,(ulong)layer_);
        pvVar18 = std::vector<LossRec,_std::allocator<LossRec>_>::operator[]
                            (pvVar12,(size_type)it_1._M_current);
        s._M_h._M_single_bucket =
             (__node_base_ptr)std::vector<int,_std::allocator<int>_>::begin(pvVar18->item_idx);
        std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
        unordered_set((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                       *)local_310);
        while( true ) {
          pvVar10 = std::
                    vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                    ::operator[](agg_vecs,(ulong)level_);
          pvVar12 = std::
                    vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                    ::operator[](pvVar10,(ulong)layer_);
          pvVar18 = std::vector<LossRec,_std::allocator<LossRec>_>::operator[]
                              (pvVar12,(size_type)it_1._M_current);
          local_318._M_current =
               (int *)std::vector<int,_std::allocator<int>_>::end(pvVar18->item_idx);
          bVar8 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                              *)&s._M_h._M_single_bucket,&local_318);
          if (!bVar8) break;
          piVar14 = __gnu_cxx::
                    __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                    operator*((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                               *)&s._M_h._M_single_bucket);
          pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                              ((vector<int,_std::allocator<int>_> *)local_288,(long)*piVar14);
          std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::insert
                    ((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *
                     )local_310,pvVar23);
          __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
          operator++((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     &s._M_h._M_single_bucket,0);
        }
        s_iter.super__Node_iterator_base<int,_false>._M_cur._4_4_ = 0.0;
        local_340._M_cur =
             (__node_type *)
             std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
             begin((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                   local_310);
        while( true ) {
          local_348._M_cur =
               (__node_type *)
               std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
               end((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_> *)
                   local_310);
          bVar8 = std::__detail::operator!=(&local_340,&local_348);
          if (!bVar8) break;
          piVar22 = std::__detail::_Node_iterator<int,_true,_false>::operator*
                              ((_Node_iterator<int,_true,_false> *)&local_340);
          pvVar18 = std::vector<LossRec,_std::allocator<LossRec>_>::operator[]
                              (pvVar11,(long)*piVar22);
          s_iter.super__Node_iterator_base<int,_false>._M_cur._4_4_ =
               pvVar18->loss + s_iter.super__Node_iterator_base<int,_false>._M_cur._4_4_;
          local_350._M_cur =
               (__node_type *)
               std::__detail::_Node_iterator<int,_true,_false>::operator++
                         ((_Node_iterator<int,_true,_false> *)&local_340,0);
        }
        pvVar10 = std::
                  vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                  ::operator[](agg_vecs,(ulong)level_);
        pvVar12 = std::
                  vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                  ::operator[](pvVar10,(ulong)layer_);
        pvVar18 = std::vector<LossRec,_std::allocator<LossRec>_>::operator[]
                            (pvVar12,(size_type)it_1._M_current);
        local_358 = (int *)std::vector<int,_std::allocator<int>_>::begin(pvVar18->item_idx);
        s._M_h._M_single_bucket = (__node_base_ptr)local_358;
        while( true ) {
          pvVar10 = std::
                    vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                    ::operator[](agg_vecs,(ulong)level_);
          pvVar12 = std::
                    vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                    ::operator[](pvVar10,(ulong)layer_);
          pvVar18 = std::vector<LossRec,_std::allocator<LossRec>_>::operator[]
                              (pvVar12,(size_type)it_1._M_current);
          local_370.super__Vector_base<float,_std::allocator<float>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage =
               (pointer)std::vector<int,_std::allocator<int>_>::end(pvVar18->item_idx);
          bVar8 = __gnu_cxx::operator!=
                            ((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                              *)&s._M_h._M_single_bucket,
                             (__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                              *)&local_370.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                 .super__Vector_impl_data._M_end_of_storage);
          if (!bVar8) break;
          pvVar10 = std::
                    vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                    ::operator[](agg_vecs,(ulong)level_);
          pvVar12 = std::
                    vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                    ::operator[](pvVar10,(ulong)layer_);
          pvVar18 = std::vector<LossRec,_std::allocator<LossRec>_>::operator[]
                              (pvVar12,(size_type)it_1._M_current);
          bVar8 = std::operator==(&pvVar18->item_prop,(nullptr_t)0x0);
          if (bVar8) {
            _auStack_388 = (pointer)0x0;
            pfStack_380 = (pointer)0x0;
            local_378 = (pointer)0x0;
            std::vector<float,_std::allocator<float>_>::vector
                      ((vector<float,_std::allocator<float>_> *)auStack_388);
            std::
            make_shared<std::vector<float,std::allocator<float>>,std::vector<float,std::allocator<float>>>
                      (&local_370);
            pvVar10 = std::
                      vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                      ::operator[](agg_vecs,(ulong)level_);
            pvVar12 = std::
                      vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                      ::operator[](pvVar10,(ulong)layer_);
            pvVar18 = std::vector<LossRec,_std::allocator<LossRec>_>::operator[]
                                (pvVar12,(size_type)it_1._M_current);
            std::shared_ptr<std::vector<float,_std::allocator<float>_>_>::operator=
                      (&pvVar18->item_prop,
                       (shared_ptr<std::vector<float,_std::allocator<float>_>_> *)&local_370);
            std::shared_ptr<std::vector<float,_std::allocator<float>_>_>::~shared_ptr
                      ((shared_ptr<std::vector<float,_std::allocator<float>_>_> *)&local_370);
            std::vector<float,_std::allocator<float>_>::~vector
                      ((vector<float,_std::allocator<float>_> *)auStack_388);
          }
          if (s_iter.super__Node_iterator_base<int,_false>._M_cur._4_4_ <= 0.0) {
            pvVar10 = std::
                      vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                      ::operator[](agg_vecs,(ulong)level_);
            pvVar12 = std::
                      vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                      ::operator[](pvVar10,(ulong)layer_);
            pvVar18 = std::vector<LossRec,_std::allocator<LossRec>_>::operator[]
                                (pvVar12,(size_type)it_1._M_current);
            peVar16 = std::
                      __shared_ptr_access<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)&pvVar18->item_prop);
            local_3b0 = 0.0;
            std::vector<float,_std::allocator<float>_>::push_back(peVar16,&local_3b0);
          }
          else {
            z._4_4_ = -1;
            piVar14 = __gnu_cxx::
                      __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                      operator*((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                 *)&s._M_h._M_single_bucket);
            pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                                ((vector<int,_std::allocator<int>_> *)local_288,(long)*piVar14);
            pvVar18 = std::vector<LossRec,_std::allocator<LossRec>_>::operator[]
                                (pvVar11,(long)*pvVar23);
            i_4 = (size_t)pvVar18->item_idx;
            for (local_3a0 = 0; uVar6 = local_3a0,
                sVar9 = std::vector<int,_std::allocator<int>_>::size
                                  ((vector<int,_std::allocator<int>_> *)i_4), uVar6 < sVar9;
                local_3a0 = local_3a0 + 1) {
              pvVar24 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)i_4,local_3a0);
              iVar4 = *pvVar24;
              piVar14 = __gnu_cxx::
                        __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                        operator*((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)&s._M_h._M_single_bucket);
              if (iVar4 == *piVar14) {
                z._4_4_ = (int)local_3a0;
                break;
              }
            }
            if (z._4_4_ < 0) {
              pvVar10 = std::
                        vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                        ::operator[](agg_vecs,(ulong)level_);
              pvVar12 = std::
                        vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                        ::operator[](pvVar10,(ulong)layer_);
              pvVar18 = std::vector<LossRec,_std::allocator<LossRec>_>::operator[]
                                  (pvVar12,(size_type)it_1._M_current);
              peVar16 = std::
                        __shared_ptr_access<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        ::operator->((__shared_ptr_access<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                      *)&pvVar18->item_prop);
              local_3ac = 0.0;
              std::vector<float,_std::allocator<float>_>::push_back(peVar16,&local_3ac);
            }
            else {
              piVar14 = __gnu_cxx::
                        __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                        operator*((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                   *)&s._M_h._M_single_bucket);
              pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                                  ((vector<int,_std::allocator<int>_> *)local_288,(long)*piVar14);
              pvVar18 = std::vector<LossRec,_std::allocator<LossRec>_>::operator[]
                                  (pvVar11,(long)*pvVar23);
              if (pvVar18->loss <= 0.0) {
                pvVar10 = std::
                          vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                          ::operator[](agg_vecs,(ulong)level_);
                pvVar12 = std::
                          vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                          ::operator[](pvVar10,(ulong)layer_);
                pvVar18 = std::vector<LossRec,_std::allocator<LossRec>_>::operator[]
                                    (pvVar12,(size_type)it_1._M_current);
                peVar16 = std::
                          __shared_ptr_access<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)&pvVar18->item_prop);
                local_3a8 = 0.0;
                std::vector<float,_std::allocator<float>_>::push_back(peVar16,&local_3a8);
              }
              else {
                pvVar10 = std::
                          vector<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>,_std::allocator<std::vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>_>_>
                          ::operator[](agg_vecs,(ulong)level_);
                pvVar12 = std::
                          vector<std::vector<LossRec,_std::allocator<LossRec>_>,_std::allocator<std::vector<LossRec,_std::allocator<LossRec>_>_>_>
                          ::operator[](pvVar10,(ulong)layer_);
                pvVar18 = std::vector<LossRec,_std::allocator<LossRec>_>::operator[]
                                    (pvVar12,(size_type)it_1._M_current);
                peVar16 = std::
                          __shared_ptr_access<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)&pvVar18->item_prop);
                this_01 = &s._M_h._M_single_bucket;
                piVar14 = __gnu_cxx::
                          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator*((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)this_01);
                pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)local_288,(long)*piVar14);
                pvVar18 = std::vector<LossRec,_std::allocator<LossRec>_>::operator[]
                                    (pvVar11,(long)*pvVar23);
                fVar1 = pvVar18->loss;
                piVar14 = __gnu_cxx::
                          __normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
                          operator*((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>
                                     *)this_01);
                pvVar23 = std::vector<int,_std::allocator<int>_>::operator[]
                                    ((vector<int,_std::allocator<int>_> *)local_288,(long)*piVar14);
                pvVar18 = std::vector<LossRec,_std::allocator<LossRec>_>::operator[]
                                    (pvVar11,(long)*pvVar23);
                this_02 = std::
                          __shared_ptr_access<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          ::operator->((__shared_ptr_access<std::vector<float,_std::allocator<float>_>,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                        *)&pvVar18->item_prop);
                pvVar15 = std::vector<float,_std::allocator<float>_>::at(this_02,(long)z._4_4_);
                local_3a4 = (fVar1 * *pvVar15) /
                            s_iter.super__Node_iterator_base<int,_false>._M_cur._4_4_;
                std::vector<float,_std::allocator<float>_>::push_back(peVar16,&local_3a4);
              }
            }
          }
          __gnu_cxx::__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_>::
          operator++((__normal_iterator<const_int_*,_std::vector<int,_std::allocator<int>_>_> *)
                     &s._M_h._M_single_bucket,0);
        }
        std::unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>::
        ~unordered_set((unordered_set<int,_std::hash<int>,_std::equal_to<int>,_std::allocator<int>_>
                        *)local_310);
      }
      it_1._M_current = it_1._M_current + 1;
    }
    std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_288);
  }
  return;
}

Assistant:

void fmcalc::compute_item_proportions(std::vector<std::vector<std::vector <LossRec>>> &agg_vecs, const std::vector<OASIS_FLOAT> &guls, unsigned int level_, unsigned int layer_,unsigned int previous_layer_,bool allowzeros)
{

	if (layer_ == 1) {
		std::vector<OASIS_FLOAT> items_prop (guls.size(), 0);
		int from_level = 1;
		int to_level = agg_vecs.size();
		if (allocrule_ == 3) {
			from_level = level_;
			to_level = from_level + 1;
		}
		for (int level = 1; level < to_level; level++) {
			vector <LossRec> &agg_vec = agg_vecs[level][layer_];
			vector <LossRec>& previous_agg_vec = agg_vecs[level-1][layer_];
			OASIS_FLOAT loss_total = 0;
			OASIS_FLOAT retained_loss_total = 0;
			OASIS_FLOAT previous_proportions_total = 0;
			auto p_iter = previous_agg_vec.begin();
			while (p_iter != previous_agg_vec.end()) {
				previous_proportions_total += p_iter->proportion;
				p_iter++;
			}
			auto iter = agg_vec.begin();
 			while (iter != agg_vec.end()) {
				if (iter->loss > 0 || iter->retained_loss > 0 || allowzeros == true) {
					OASIS_FLOAT total = 0;
					if (iter->item_idx) {
						if (iter->item_prop == nullptr) {
							iter->item_prop = std::make_shared<std::vector<OASIS_FLOAT>>(std::vector<OASIS_FLOAT>((iter->item_idx)->size(), 0));
						}
						else {
							//(iter->item_prop)->resize((iter->item_idx)->size(), 0);
							iter->item_prop = std::make_shared<std::vector<OASIS_FLOAT>>(std::vector<OASIS_FLOAT>((iter->item_idx)->size(), 0));
						}
						for (int idx : *(iter->item_idx)) {	// if this is the first level there should only be one item_idx
							total += guls[idx];
						}
					}
					iter->gul_total = total;
					loss_total += iter->loss;
					retained_loss_total += iter->retained_loss;
				}
				else {
					iter->gul_total = 0;
					retained_loss_total += iter->retained_loss;
				}
				iter++;
			}
			if (loss_total <= 0 && previous_proportions_total > 0.01) {
				// check level and layer_
				// if there is no loss_total loss just copy previous level proportions
				auto iter = agg_vec.begin();		// loop through again to work out proportion
				//auto previous_iter = previous_agg_vec.begin();		// loop through again to work out proportion
				while (iter != agg_vec.end()) {
					if (iter->item_idx) {
						for (int idx : *(iter->item_idx)) {
							//std::vector<OASIS_FLOAT>& v = *(iter->item_prop);
							iter->proportion = iter->proportion + items_prop[idx];
						}
					}
					iter++;
				}
			}
			else {
				iter = agg_vec.begin();		// loop thru again to work out proportion
				int agg_vec_idx = 0;
				while (iter != agg_vec.end()) {
					if (iter->loss > 0 && loss_total > 0) {
						iter->proportion = iter->loss / loss_total;
					}
					else {
						iter->proportion = 0;
					}
					if (level == 1) {
						OASIS_FLOAT total = 0;
						if (iter->item_idx) {
							for (int idx : *(iter->item_idx)) {
								total += guls[idx];
							}
						}
						int i = 0;
						if (total > 0) {
							for (int idx : *(iter->item_idx)) {
								if (iter->item_prop != nullptr) {
									std::vector<OASIS_FLOAT>& v = *(iter->item_prop);
									v[i] = guls[idx] / iter->gul_total;
								}
								items_prop[idx] = (guls[idx] / total) * iter->proportion;
								i++;
							}
						}
					}
					else {
						OASIS_FLOAT prop_total = 0;
						if (iter->item_idx) {
							for (int idx : *(iter->item_idx)) {
								prop_total += items_prop[idx];
							}
						}
						int i = 0;
						if (prop_total > 0) {
							if (iter->item_idx) {
								for (int idx : *(iter->item_idx)) {
									if (iter->item_prop != nullptr) {
										std::vector<OASIS_FLOAT>& v = *(iter->item_prop);
										v[i] = items_prop[idx] / prop_total;
									}
									items_prop[idx] = (items_prop[idx] / prop_total) * iter->proportion;									
									i++;
								}
							}
						}
						else {
							if (iter->item_idx) {
								iter->item_prop = previous_agg_vec[agg_vec_idx].item_prop;
								//iter->limit_surplus = 5678;
							}
						}
					}
					iter++;
					agg_vec_idx++;
				}
			}			
		}
	}
	else {
		if (previous_layer_ < layer_) {
			vector <LossRec> &prev_agg_vec = agg_vecs[level_][1];
			vector <LossRec> &current_agg_vec = agg_vecs[level_][layer_];
			size_t iMax =  prev_agg_vec.size();
			if (current_agg_vec.size() > iMax) iMax = current_agg_vec.size();
			for (size_t i = 0; i < iMax; i++) {
				current_agg_vec[i].proportion = prev_agg_vec[i].proportion;
				current_agg_vec[i].item_prop = prev_agg_vec[i].item_prop;
			}			
		}
		else {			
			vector <LossRec> &prev_agg_vec = agg_vecs[level_ - 1][previous_layer_];
			vector <LossRec> &prev_agg_vec_base = agg_vecs[level_ - 1][1];
			for (size_t i = 0; i < prev_agg_vec.size(); i++) {
				//if (prev_agg_vec[i].item_prop->size() == 0) {
				if (prev_agg_vec[i].item_prop == nullptr) {
					//prev_agg_vec[i].loss = prev_agg_vec_base[i].loss;
					prev_agg_vec[i].item_prop = prev_agg_vec_base[i].item_prop;
				}
			}
			//

			std::vector<int> v(guls.size(), -1);
			//v.resize(guls.size(), -1);
			auto iter = prev_agg_vec.begin();
			int j = 0;

			while (iter != prev_agg_vec.end()) {
				if (iter->item_idx) {
					auto it = iter->item_idx->begin();
					while (it != iter->item_idx->end()) {
						v[*it] = j;
						it++;
					}
				}
				j++;
				iter++;
			}
			for (size_t y = 0; y < agg_vecs[level_][layer_].size(); y++) {
				if (agg_vecs[level_][layer_][y].item_idx != nullptr) {
					auto it = agg_vecs[level_][layer_][y].item_idx->begin();
					// 1 create an item id  to prev_agg_vec index
					// 2 use below loop to create a set which will then be used to iterate and get previous_gul_total
					std::unordered_set<int> s;
					while (it != agg_vecs[level_][layer_][y].item_idx->end()) {
						s.insert(v[*it]);
						//prev_gul_total += prev_agg_vec[*it].loss;
						it++;
					}

					OASIS_FLOAT prev_gul_total = 0;
					auto s_iter = s.begin();
					while (s_iter != s.end()) {
						prev_gul_total += prev_agg_vec[*s_iter].loss;
						s_iter++;
					}

					// agg_vecs[level_][layer_][y].loss = prev_gul_total;
					it = agg_vecs[level_][layer_][y].item_idx->begin();
					while (it != agg_vecs[level_][layer_][y].item_idx->end()) {
						if (agg_vecs[level_][layer_][y].item_prop == nullptr) {
							agg_vecs[level_][layer_][y].item_prop = std::make_shared<std::vector<OASIS_FLOAT>>(std::vector<OASIS_FLOAT>());
						}
						if (prev_gul_total > 0) {
							int j = -1;
							const std::vector<int>& z = *(prev_agg_vec[v[*it]].item_idx);
							for (size_t i = 0; i < z.size(); i++) {
								if (z[i] == *it) {
									j = i;
									break;
								}
							}
							// this is recomputing the first layers proportions
							if (j > -1) {
								if (prev_agg_vec[v[*it]].loss > 0 ) agg_vecs[level_][layer_][y].item_prop->push_back(prev_agg_vec[v[*it]].loss * prev_agg_vec[v[*it]].item_prop->at(j) / prev_gul_total);
								else agg_vecs[level_][layer_][y].item_prop->push_back(0);
							}
							else {
								agg_vecs[level_][layer_][y].item_prop->push_back(0);
							}

						}
						else {
							agg_vecs[level_][layer_][y].item_prop->push_back(0);
						}
						it++;
					}
				}
			}
		}		
		return;

	}
}